

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLimits.cpp
# Opt level: O2

void __thiscall
glcts::GeometryShaderMaxOutputComponentsSinglePointTest::prepareGeometryShader
          (GeometryShaderMaxOutputComponentsSinglePointTest *this,string *out_shader_code)

{
  ostream *poVar1;
  int i_1;
  int i;
  int iVar2;
  stringstream stream;
  string local_1d8 [32];
  stringstream local_1b8 [16];
  ostream local_1a8;
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::operator<<(&local_1a8,
                  "${VERSION}\n\n${GEOMETRY_SHADER_REQUIRE}\n${GEOMETRY_POINT_SIZE_ENABLE}\n\nlayout(points)                 in;\nlayout(points, max_vertices=1) out;\n\n"
                 );
  std::operator<<(&local_1a8,"// definitions of gs_fs_out_ varyings go here\n");
  for (iVar2 = 0; iVar2 < this->m_n_available_vectors; iVar2 = iVar2 + 1) {
    poVar1 = std::operator<<(&local_1a8,"flat out ivec4");
    poVar1 = std::operator<<(poVar1," ");
    poVar1 = std::operator<<(poVar1,"gs_fs_out_");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar2);
    std::operator<<(poVar1,";\n");
  }
  std::operator<<(&local_1a8,
                  "\nvoid main()\n{\n    int index = 1;\n\n    // gs_fs_out assignments go here\n");
  for (iVar2 = 0; iVar2 < this->m_n_available_vectors; iVar2 = iVar2 + 1) {
    poVar1 = std::operator<<(&local_1a8,"    ");
    poVar1 = std::operator<<(poVar1,"gs_fs_out_");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar2);
    std::operator<<(poVar1," = ivec4(index++, index++, index++, index++);\n");
  }
  std::operator<<(&local_1a8,
                  "\n    gl_PointSize = 2.0;\n    gl_Position = vec4(0.0, 0.0, 0.0, 1.0);\n\n    EmitVertex();\n    EndPrimitive();\n}\n"
                 );
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)out_shader_code,local_1d8);
  std::__cxx11::string::~string(local_1d8);
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return;
}

Assistant:

void GeometryShaderMaxOutputComponentsSinglePointTest::prepareGeometryShader(std::string& out_shader_code) const
{
	std::stringstream stream;

	stream << m_geometry_shader_code_preamble;
	stream << m_common_shader_code_gs_fs_out_definitions;

	for (int i = 0; i < m_n_available_vectors; ++i)
	{
		stream << m_geometry_shader_code_flat_out_ivec4 << " " << m_common_shader_code_gs_fs_out << i << ";\n";
	}

	stream << m_geometry_shader_code_body_begin;

	for (int i = 0; i < m_n_available_vectors; ++i)
	{
		stream << "    " << m_common_shader_code_gs_fs_out << i << m_geometry_shader_code_assignment;
	}

	stream << m_geometry_shader_code_body_end;

	out_shader_code = stream.str();
}